

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

int __thiscall QSslSocketPrivate::init(QSslSocketPrivate *this,EVP_PKEY_CTX *ctx)

{
  TlsCryptograph *pTVar1;
  int extraout_EAX;
  int iVar2;
  
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.abortCalled = false;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = false;
  this->flushTriggered = false;
  this->mode = UnencryptedMode;
  *(undefined4 *)((long)&this->mode + 3) = 0;
  QIODevicePrivate::QRingBufferRef::clear
            ((QRingBufferRef *)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90);
  QIODevicePrivate::QRingBufferRef::clear
            ((QRingBufferRef *)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x98);
  QSslCertificate::clear(&(this->configuration).peerCertificate);
  QList<QSslCertificate>::clear(&(this->configuration).peerCertificateChain);
  pTVar1 = (this->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
  if (pTVar1 != (TlsCryptograph *)0x0) {
    iVar2 = (**(code **)(*(long *)pTVar1 + 0x60))
                      (pTVar1,*(undefined8 *)
                               &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.
                                field_0x8,this);
    return iVar2;
  }
  return extraout_EAX;
}

Assistant:

void QSslSocketPrivate::init()
{
    // TLSTODO: delete those data members.
    mode = QSslSocket::UnencryptedMode;
    autoStartHandshake = false;
    connectionEncrypted = false;
    ignoreAllSslErrors = false;
    abortCalled = false;
    pendingClose = false;
    flushTriggered = false;
    // We don't want to clear the ignoreErrorsList, so
    // that it is possible setting it before connecting.

    buffer.clear();
    writeBuffer.clear();
    configuration.peerCertificate.clear();
    configuration.peerCertificateChain.clear();

    if (backend.get()) {
        Q_ASSERT(q_ptr);
        backend->init(static_cast<QSslSocket *>(q_ptr), this);
    }
}